

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O0

void gflags::anon_unknown_5::Test_ProgramUsageTest_BaseTest::Run(void)

{
  FlagSaver local_10;
  FlagSaver fs;
  
  FlagSaver::FlagSaver(&local_10);
  fprintf(_stderr,"Running test %s/%s\n","ProgramUsageTest","BaseTest");
  RunTest();
  FlagSaver::~FlagSaver(&local_10);
  return;
}

Assistant:

TEST(ProgramUsageTest, BaseTest) {  // Depends on 1st arg to ParseCommandLineFlags()
  EXPECT_STREQ("/test/argv/for/gflags_unittest: "
               "<useless flag> [...]\nDoes something useless.\n",
               ProgramUsage());
}